

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void __thiscall DCanvas::~DCanvas(DCanvas *this)

{
  uint uVar1;
  DCanvas *pDVar2;
  DObject **ppDVar3;
  DCanvas **ppDVar4;
  PClass *this_00;
  DObject **ppDVar5;
  DCanvas **ppDVar6;
  
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f9480;
  ppDVar4 = &CanvasChain;
  while (ppDVar6 = ppDVar4, pDVar2 = *ppDVar6, pDVar2 != (DCanvas *)0x0) {
    ppDVar4 = &pDVar2->Next;
    if (pDVar2 == this) {
      *ppDVar6 = pDVar2->Next;
      DObject::~DObject(&this->super_DObject);
      return;
    }
  }
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006ecf30;
  if (PClass::bShutdown == false) {
    this_00 = DObject::GetClass(&this->super_DObject);
    uVar1 = (this->super_DObject).ObjectFlags;
    if (((uVar1 & 0x40) == 0) && (PClass::bShutdown == false)) {
      if (-1 < (char)uVar1) {
        Printf("Warning: \'%s\' is freed outside the GC process.\n");
      }
      DObject::StaticPointerSubstitution(&this->super_DObject,(DObject *)0x0,false);
      ppDVar3 = (DObject **)&GC::Root;
      do {
        ppDVar5 = ppDVar3;
        pDVar2 = (DCanvas *)*ppDVar5;
        if (pDVar2 == (DCanvas *)0x0) goto LAB_003910f9;
        ppDVar3 = &(pDVar2->super_DObject).ObjNext;
      } while (pDVar2 != this);
      *ppDVar5 = (this->super_DObject).ObjNext;
      if (&(this->super_DObject).ObjNext == GC::SweepPos) {
        GC::SweepPos = ppDVar5;
      }
LAB_003910f9:
      if (((this->super_DObject).ObjectFlags & 7) == 0) {
        ppDVar3 = (DObject **)&GC::Gray;
        do {
          ppDVar5 = ppDVar3;
          pDVar2 = (DCanvas *)*ppDVar5;
          if (pDVar2 == (DCanvas *)0x0) goto LAB_00391121;
          ppDVar3 = &(pDVar2->super_DObject).GCNext;
        } while (pDVar2 != this);
        *ppDVar5 = (this->super_DObject).GCNext;
      }
    }
LAB_00391121:
    if (this_00 != (PClass *)0x0) {
      PClass::DestroySpecials(this_00,this);
    }
  }
  return;
}

Assistant:

DCanvas::~DCanvas ()
{
	// Remove from list of active canvases
	DCanvas *probe = CanvasChain, **prev;

	prev = &CanvasChain;
	probe = CanvasChain;

	while (probe != NULL)
	{
		if (probe == this)
		{
			*prev = probe->Next;
			break;
		}
		prev = &probe->Next;
		probe = probe->Next;
	}
}